

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

uint __thiscall Kernel::Clause::computeWeightForClauseSelection(Clause *this,Options *opt)

{
  SplitSet *pSVar1;
  long lVar2;
  uint uVar3;
  uint numeralWeight;
  Term *pTVar4;
  uint splitWeight;
  ulong uVar5;
  bool derivedFromGoal;
  NonVariableNonTypeIterator it;
  NonVariableNonTypeIterator local_68;
  
  uVar3 = this->_weight;
  if (uVar3 == 0) {
    uVar3 = computeWeight(this);
  }
  numeralWeight = 0;
  splitWeight = 0;
  if (((opt->_nonliteralsInClauseWeight).super_OptionValue<bool>.super_AbstractOptionValue.
       field_0x92 == '\x01') &&
     (pSVar1 = (this->super_Unit)._inference._splits, pSVar1 != (SplitSet *)0x0)) {
    splitWeight = (uint)pSVar1->_size;
  }
  if ((opt->_increasedNumeralWeight).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 ==
      '\x01') {
    numeralWeight = getNumeralWeight(this);
  }
  if ((undefined1  [48])((undefined1  [48])(this->super_Unit)._inference & (undefined1  [48])0x18)
      == (undefined1  [48])0x0) {
    derivedFromGoal = false;
  }
  else {
    derivedFromGoal = true;
    if ((opt->_restrictNWCtoGC).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 ==
        '\x01') {
      derivedFromGoal = false;
      for (uVar5 = 0; uVar5 < ((uint)*(undefined8 *)&this->field_0x38 & 0xfffff); uVar5 = uVar5 + 1)
      {
        NonVariableNonTypeIterator::NonVariableNonTypeIterator
                  (&local_68,&this->_literals[uVar5]->super_Term,false);
        while (lVar2 = DAT_00a14190, local_68._stack._cursor != local_68._stack._stack) {
          pTVar4 = NonVariableNonTypeIterator::next(&local_68);
          derivedFromGoal =
               (bool)(derivedFromGoal |
                     (*(byte *)(*(long *)(*(long *)(lVar2 + 0x60) + (ulong)pTVar4->_functor * 8) +
                               0x41) & 0x40) >> 6);
        }
        NonVariableNonTypeIterator::~NonVariableNonTypeIterator(&local_68);
      }
    }
  }
  uVar3 = computeWeightForClauseSelection(uVar3,splitWeight,numeralWeight,derivedFromGoal,opt);
  return uVar3;
}

Assistant:

unsigned Clause::computeWeightForClauseSelection(const Options& opt) const
{
  unsigned w = 0;
  if (_weight) {
    w = _weight;
  } else {
    w = computeWeight();
  }

  unsigned splWeight = 0;
  if (opt.nonliteralsInClauseWeight()) {
    splWeight = splitWeight(); // no longer includes propWeight
  }

  // hack: computation of getNumeralWeight is potentially expensive, so we only compute it if
  // the option increasedNumeralWeight is set to true.
  unsigned numeralWeight = 0;
  if (opt.increasedNumeralWeight())
  {
    numeralWeight = getNumeralWeight();
  }

  bool derivedFromGoal = Unit::derivedFromGoal();
  if(derivedFromGoal && opt.restrictNWCtoGC()){
    bool found = false;
    for(unsigned i=0;i<_length;i++){
      NonVariableNonTypeIterator it(_literals[i]);
      while(it.hasNext()){
        found |= env.signature->getFunction(it.next()->functor())->inGoal();
      }
    }
    if(!found){ derivedFromGoal=false; }
  }

  return Clause::computeWeightForClauseSelection(w, splWeight, numeralWeight, derivedFromGoal, opt);
}